

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.hh
# Opt level: O3

void __thiscall
tinyusdz::ascii::AsciiParser::VariableDef::VariableDef(VariableDef *this,VariableDef *rhs)

{
  pointer pcVar1;
  _Manager_type p_Var2;
  _Invoker_type p_Var3;
  
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  pcVar1 = (rhs->type)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (rhs->type)._M_string_length);
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (rhs->name)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + (rhs->name)._M_string_length);
  this->allow_array_type = rhs->allow_array_type;
  *(undefined8 *)&(this->post_parse_handler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->post_parse_handler).super__Function_base._M_functor + 8) = 0;
  (this->post_parse_handler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->post_parse_handler)._M_invoker = (_Invoker_type)0x0;
  p_Var2 = (rhs->post_parse_handler).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->post_parse_handler,(_Any_data *)&rhs->post_parse_handler,
              __clone_functor);
    p_Var3 = (rhs->post_parse_handler)._M_invoker;
    (this->post_parse_handler).super__Function_base._M_manager =
         (rhs->post_parse_handler).super__Function_base._M_manager;
    (this->post_parse_handler)._M_invoker = p_Var3;
  }
  return;
}

Assistant:

VariableDef(const VariableDef &rhs) = default;